

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::grisu2_prettify(char *buffer,size_t *size,int exp,int precision,bool upper)

{
  type tVar1;
  char *pcVar2;
  type tVar3;
  long lVar4;
  long lVar5;
  char local_55;
  int local_54;
  char local_4d;
  int offset;
  int local_48;
  int num_zeros;
  int fractional_size;
  char *p;
  undefined4 local_30;
  int local_2c;
  int exp_threshold;
  int full_exp;
  int int_size;
  int iStack_1c;
  bool upper_local;
  int precision_local;
  int exp_local;
  size_t *size_local;
  char *buffer_local;
  
  exp_threshold = (int)*size;
  local_2c = exp_threshold + exp;
  local_30 = 0x15;
  full_exp._3_1_ = upper;
  int_size = precision;
  iStack_1c = exp;
  _precision_local = size;
  size_local = (size_t *)buffer;
  if ((local_2c < exp_threshold) || (0x15 < local_2c)) {
    if ((local_2c < 1) || (0x15 < local_2c)) {
      if ((local_2c < -5) || (0 < local_2c)) {
        format_exp_notation(buffer,size,exp,precision,upper);
      }
      else {
        local_54 = 2 - local_2c;
        memmove(buffer + local_54,buffer,*size);
        *(undefined1 *)size_local = 0x30;
        *(undefined1 *)((long)size_local + 1) = 0x2e;
        local_55 = '0';
        std::uninitialized_fill_n<char*,int,char>
                  ((char *)((long)size_local + 2),-local_2c,&local_55);
        tVar1 = to_unsigned<int>(exp_threshold + local_54);
        *_precision_local = (ulong)tVar1;
      }
    }
    else {
      local_48 = -exp;
      lVar4 = (long)local_2c;
      lVar5 = (long)local_2c;
      tVar1 = to_unsigned<int>(local_48);
      memmove(buffer + lVar4 + 1,buffer + lVar5,(ulong)tVar1);
      *(undefined1 *)((long)size_local + (long)local_2c) = 0x2e;
      offset = int_size - local_48;
      if (0 < offset) {
        local_4d = '0';
        std::uninitialized_fill_n<char*,int,char>
                  ((char *)((long)size_local + *_precision_local + 1),offset,&local_4d);
        tVar1 = to_unsigned<int>(offset);
        *_precision_local = (ulong)tVar1 + *_precision_local;
      }
      *_precision_local = *_precision_local + 1;
    }
  }
  else {
    p._7_1_ = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              (buffer + exp_threshold,local_2c - exp_threshold,(char *)((long)&p + 7));
    pcVar2 = (char *)((long)size_local + (long)local_2c);
    _fractional_size = pcVar2;
    if (0 < int_size) {
      _fractional_size = pcVar2 + 1;
      *pcVar2 = '.';
      num_zeros._3_1_ = 0x30;
      std::uninitialized_fill_n<char*,int,char>
                (_fractional_size,int_size,(char *)((long)&num_zeros + 3));
      _fractional_size = _fractional_size + int_size;
    }
    tVar3 = to_unsigned<long>((long)_fractional_size - (long)size_local);
    *_precision_local = tVar3;
  }
  return;
}

Assistant:

FMT_FUNC void grisu2_prettify(char *buffer, size_t &size, int exp,
                              int precision, bool upper) {
  // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
  int int_size = static_cast<int>(size);
  int full_exp = int_size + exp;
  const int exp_threshold = 21;
  if (int_size <= full_exp && full_exp <= exp_threshold) {
    // 1234e7 -> 12340000000[.0+]
    std::uninitialized_fill_n(buffer + int_size, full_exp - int_size, '0');
    char *p = buffer + full_exp;
    if (precision > 0) {
      *p++ = '.';
      std::uninitialized_fill_n(p, precision, '0');
      p += precision;
    }
    size = to_unsigned(p - buffer);
  } else if (0 < full_exp && full_exp <= exp_threshold) {
    // 1234e-2 -> 12.34[0+]
    int fractional_size = -exp;
    std::memmove(buffer + full_exp + 1, buffer + full_exp,
                 to_unsigned(fractional_size));
    buffer[full_exp] = '.';
    int num_zeros = precision - fractional_size;
    if (num_zeros > 0) {
      std::uninitialized_fill_n(buffer + size + 1, num_zeros, '0');
      size += to_unsigned(num_zeros);
    }
    ++size;
  } else if (-6 < full_exp && full_exp <= 0) {
    // 1234e-6 -> 0.001234
    int offset = 2 - full_exp;
    std::memmove(buffer + offset, buffer, size);
    buffer[0] = '0';
    buffer[1] = '.';
    std::uninitialized_fill_n(buffer + 2, -full_exp, '0');
    size = to_unsigned(int_size + offset);
  } else {
    format_exp_notation(buffer, size, exp, precision, upper);
  }
}